

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonRemoveFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  uchar *puVar2;
  JsonNode *pJVar3;
  uint local_64;
  u32 i;
  char *zPath;
  JsonNode *pNode;
  JsonParse x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  if (0 < argc) {
    x._40_8_ = argv;
    puVar2 = sqlite3_value_text(*argv);
    iVar1 = jsonParse((JsonParse *)&pNode,ctx,(char *)puVar2);
    if (iVar1 == 0) {
      for (local_64 = 1; local_64 < (uint)argc; local_64 = local_64 + 1) {
        puVar2 = sqlite3_value_text(*(sqlite3_value **)(x._40_8_ + (ulong)local_64 * 8));
        if ((puVar2 == (uchar *)0x0) ||
           (pJVar3 = jsonLookup((JsonParse *)&pNode,(char *)puVar2,(int *)0x0,ctx),
           x.aUp._1_1_ != '\0')) goto LAB_0027222e;
        if (pJVar3 != (JsonNode *)0x0) {
          pJVar3->jnFlags = pJVar3->jnFlags | 4;
        }
      }
      if ((*(byte *)(x._0_8_ + 1) & 4) == 0) {
        jsonReturnJson((JsonNode *)x._0_8_,ctx,(sqlite3_value **)0x0);
      }
LAB_0027222e:
      jsonParseReset((JsonParse *)&pNode);
    }
  }
  return;
}

Assistant:

static void jsonRemoveFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse x;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  u32 i;

  if( argc<1 ) return;
  if( jsonParse(&x, ctx, (const char*)sqlite3_value_text(argv[0])) ) return;
  assert( x.nNode );
  for(i=1; i<(u32)argc; i++){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    if( zPath==0 ) goto remove_done;
    pNode = jsonLookup(&x, zPath, 0, ctx);
    if( x.nErr ) goto remove_done;
    if( pNode ) pNode->jnFlags |= JNODE_REMOVE;
  }
  if( (x.aNode[0].jnFlags & JNODE_REMOVE)==0 ){
    jsonReturnJson(x.aNode, ctx, 0);
  }
remove_done:
  jsonParseReset(&x);
}